

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void * tcg_malloc_internal_ppc64(TCGContext_conflict10 *s,int size)

{
  TCGPool *pTVar1;
  TCGPool *pTStack_28;
  int pool_size;
  TCGPool *p;
  int size_local;
  TCGContext_conflict10 *s_local;
  
  if (0x8000 < size) {
    pTStack_28 = (TCGPool *)g_malloc((long)size + 0x10);
    pTStack_28->size = size;
    pTStack_28->next = s->pool_first_large;
    s->pool_first_large = pTStack_28;
    goto LAB_00fe46c4;
  }
  pTVar1 = s->pool_current;
  if (pTVar1 == (TCGPool *)0x0) {
    pTStack_28 = s->pool_first;
    if (pTStack_28 == (TCGPool *)0x0) {
LAB_00fe4615:
      pTStack_28 = (TCGPool *)g_malloc(0x8010);
      pTStack_28->size = 0x8000;
      pTStack_28->next = (TCGPool *)0x0;
      if (s->pool_current == (TCGPool *)0x0) {
        s->pool_first = pTStack_28;
      }
      else {
        s->pool_current->next = pTStack_28;
      }
    }
  }
  else {
    if (pTVar1->next == (TCGPool *)0x0) goto LAB_00fe4615;
    pTStack_28 = pTVar1->next;
  }
  s->pool_current = pTStack_28;
  s->pool_cur = (uint8_t *)((long)&pTStack_28[1].next + (long)size);
  s->pool_end = (uint8_t *)((long)&pTStack_28[1].next + (long)pTStack_28->size);
LAB_00fe46c4:
  s_local = (TCGContext_conflict10 *)(pTStack_28 + 1);
  return s_local;
}

Assistant:

void *tcg_malloc_internal(TCGContext *s, int size)
{
    TCGPool *p;
    int pool_size;
    
    if (size > TCG_POOL_CHUNK_SIZE) {
        /* big malloc: insert a new pool (XXX: could optimize) */
        p = g_malloc(sizeof(TCGPool) + size);
        p->size = size;
        p->next = s->pool_first_large;
        s->pool_first_large = p;
        return p->data;
    } else {
        p = s->pool_current;
        if (!p) {
            p = s->pool_first;
            if (!p)
                goto new_pool;
        } else {
            if (!p->next) {
            new_pool:
                pool_size = TCG_POOL_CHUNK_SIZE;
                p = g_malloc(sizeof(TCGPool) + pool_size);
                p->size = pool_size;
                p->next = NULL;
                if (s->pool_current) 
                    s->pool_current->next = p;
                else
                    s->pool_first = p;
            } else {
                p = p->next;
            }
        }
    }
    s->pool_current = p;
    s->pool_cur = p->data + size;
    s->pool_end = p->data + p->size;
    return p->data;
}